

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int print_preallocated(cJSON *root)

{
  int iVar1;
  char *__s;
  size_t __size;
  char *__s2;
  char *__ptr;
  char *__s_00;
  char *pcVar2;
  
  __s = (char *)cJSON_Print();
  __size = strlen(__s);
  __s2 = (char *)malloc(__size + 5);
  if (__s2 == (char *)0x0) {
LAB_00101865:
    puts("Failed to allocate memory.");
    exit(1);
  }
  __ptr = (char *)malloc(__size);
  if (__ptr == (char *)0x0) goto LAB_00101865;
  iVar1 = cJSON_PrintPreallocated(root,__s2,__size + 5 & 0xffffffff,1);
  if (iVar1 == 0) {
    puts("cJSON_PrintPreallocated failed!");
    iVar1 = strcmp(__s,__s2);
    if (iVar1 != 0) {
      __s_00 = "cJSON_PrintPreallocated not the same as cJSON_Print!";
      pcVar2 = __s2;
      goto LAB_0010180c;
    }
  }
  else {
    puts(__s2);
    iVar1 = cJSON_PrintPreallocated(root,__ptr,__size & 0xffffffff,1);
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_0010183c;
    }
    __s_00 = "cJSON_PrintPreallocated failed to show error with insufficient memory!";
    pcVar2 = __ptr;
LAB_0010180c:
    puts(__s_00);
    printf("cJSON_Print result:\n%s\n",__s);
    printf("cJSON_PrintPreallocated result:\n%s\n",pcVar2);
  }
  iVar1 = -1;
LAB_0010183c:
  free(__s);
  free(__ptr);
  free(__s2);
  return iVar1;
}

Assistant:

static int print_preallocated(cJSON *root)
{
    /* declarations */
    char *out = NULL;
    char *buf = NULL;
    char *buf_fail = NULL;
    size_t len = 0;
    size_t len_fail = 0;

    /* formatted print */
    out = cJSON_Print(root);

    /* create buffer to succeed */
    /* the extra 5 bytes are because of inaccuracies when reserving memory */
    len = strlen(out) + 5;
    buf = (char*)malloc(len);
    if (buf == NULL)
    {
        printf("Failed to allocate memory.\n");
        exit(1);
    }

    /* create buffer to fail */
    len_fail = strlen(out);
    buf_fail = (char*)malloc(len_fail);
    if (buf_fail == NULL)
    {
        printf("Failed to allocate memory.\n");
        exit(1);
    }

    /* Print to buffer */
    if (!cJSON_PrintPreallocated(root, buf, (int)len, 1)) {
        printf("cJSON_PrintPreallocated failed!\n");
        if (strcmp(out, buf) != 0) {
            printf("cJSON_PrintPreallocated not the same as cJSON_Print!\n");
            printf("cJSON_Print result:\n%s\n", out);
            printf("cJSON_PrintPreallocated result:\n%s\n", buf);
        }
        free(out);
        free(buf_fail);
        free(buf);
        return -1;
    }

    /* success */
    printf("%s\n", buf);

    /* force it to fail */
    if (cJSON_PrintPreallocated(root, buf_fail, (int)len_fail, 1)) {
        printf("cJSON_PrintPreallocated failed to show error with insufficient memory!\n");
        printf("cJSON_Print result:\n%s\n", out);
        printf("cJSON_PrintPreallocated result:\n%s\n", buf_fail);
        free(out);
        free(buf_fail);
        free(buf);
        return -1;
    }

    free(out);
    free(buf_fail);
    free(buf);
    return 0;
}